

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
Execute<duckdb::hugeint_t,int,duckdb::ArgMinMaxState<duckdb::hugeint_t,int>>
          (ArgMinMaxBase<duckdb::GreaterThan,false> *this,
          ArgMinMaxState<duckdb::hugeint_t,_int> *state,hugeint_t x_data,int y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  undefined4 in_register_00000084;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)
                      (CONCAT44(in_register_00000084,y_data) + 0x10),
                     *(idx_t *)(CONCAT44(in_register_00000084,y_data) + 0x20));
  if ((bVar1) && (*(int *)(this + 0x18) < (int)x_data.upper)) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (*(TemplatedValidityMask<unsigned_long> **)
                        (CONCAT44(in_register_00000084,y_data) + 8),
                       *(idx_t *)(CONCAT44(in_register_00000084,y_data) + 0x18));
    this[1] = (ArgMinMaxBase<duckdb::GreaterThan,false>)!bVar1;
    if (bVar1) {
      *(ArgMinMaxState<duckdb::hugeint_t,_int> **)(this + 8) = state;
      *(uint64_t *)(this + 0x10) = x_data.lower;
    }
    *(int *)(this + 0x18) = (int)x_data.upper;
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}